

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_psignd_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  uint32_t uVar1;
  
  if ((int)s->_l_MMXReg[0] < 0) {
    uVar1 = -d->_l_MMXReg[0];
  }
  else if (s->_l_MMXReg[0] == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = d->_l_MMXReg[0];
  }
  d->_l_MMXReg[0] = uVar1;
  if ((int)s->_l_MMXReg[1] < 0) {
    uVar1 = -d->_l_MMXReg[1];
  }
  else if (s->_l_MMXReg[1] == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = d->_l_MMXReg[1];
  }
  d->_l_MMXReg[1] = uVar1;
  return;
}

Assistant:

void glue(helper_palignr, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                  int32_t shift)
{
    Reg r;

    /* XXX could be checked during translation */
    if (shift >= (16 << SHIFT)) {
        r.Q(0) = 0;
        XMM_ONLY(r.Q(1) = 0);
    } else {
        shift <<= 3;
#define SHR(v, i) (i < 64 && i > -64 ? i > 0 ? v >> (i) : (v << -(i)) : 0)
#if SHIFT == 0
        r.Q(0) = SHR(s->Q(0), shift - 0) |
            SHR(d->Q(0), shift -  64);
#else
        r.Q(0) = SHR(s->Q(0), shift - 0) |
            SHR(s->Q(1), shift -  64) |
            SHR(d->Q(0), shift - 128) |
            SHR(d->Q(1), shift - 192);
        r.Q(1) = SHR(s->Q(0), shift + 64) |
            SHR(s->Q(1), shift -   0) |
            SHR(d->Q(0), shift -  64) |
            SHR(d->Q(1), shift - 128);
#endif
#undef SHR
    }

    *d = r;
}